

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::SetupForHMP(HMISong *this,int len)

{
  uint uVar1;
  int iVar2;
  BYTE *pBVar3;
  TrackInfo *pTVar4;
  TrackInfo *pTVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  this->ReadVarLen = ReadVarLenHMP;
  pBVar3 = this->MusHeader;
  if (pBVar3[8] == '\0') {
    iVar7 = 0x308;
  }
  else {
    if (*(int *)(pBVar3 + 0xb) != 0x353931 || *(int *)(pBVar3 + 8) != 0x31333130) {
      return;
    }
    iVar7 = 0x388;
  }
  uVar1 = *(uint *)(pBVar3 + 0x30);
  this->NumTracks = uVar1;
  if (0 < (int)uVar1) {
    (this->super_MIDIStreamer).Division = *(int *)(pBVar3 + 0x38);
    (this->super_MIDIStreamer).InitialTempo = 1000000;
    pTVar5 = (TrackInfo *)operator_new__((ulong)uVar1 * 0x38 + 0x38);
    this->Tracks = pTVar5;
    iVar6 = 0;
    if (iVar7 <= len + -0xc) {
      iVar6 = 0;
      iVar8 = 1;
      do {
        iVar2 = *(int *)(pBVar3 + (long)iVar7 + 4);
        iVar9 = len - iVar7;
        if (iVar2 < len - iVar7) {
          iVar9 = iVar2;
        }
        if (0xc < iVar9) {
          pTVar5[iVar6].TrackBegin = pBVar3 + (long)iVar7 + 0xc;
          pTVar5[iVar6].TrackP = 0;
          pTVar5[iVar6].MaxTrackP = (ulong)(iVar9 - 0xc);
          pTVar4 = pTVar5 + iVar6;
          pTVar4->Designation[0] = 0xa000;
          pTVar4->Designation[1] = 0xa00a;
          pTVar4->Designation[2] = 0xa002;
          pTVar4->Designation[3] = 0;
          iVar6 = iVar6 + 1;
        }
        if ((int)uVar1 <= iVar8) break;
        iVar7 = iVar7 + iVar2;
        iVar8 = iVar8 + 1;
      } while (iVar7 <= len + -0xc);
    }
    this->NumTracks = iVar6;
  }
  return;
}

Assistant:

void HMISong::SetupForHMP(int len)
{
	int track_data;
	int i, p;

	ReadVarLen = ReadVarLenHMP;
	if (MusHeader[8] == 0)
	{
		track_data = HMP_TRACK_OFFSET_0;
	}
	else if (memcmp(MusHeader + 8, HMP_NEW_DATE, sizeof(HMP_NEW_DATE)) == 0)
	{
		track_data = HMP_TRACK_OFFSET_1;
	}
	else
	{ // unknown HMIMIDIP version
		return;
	}

	NumTracks = GetInt(MusHeader + HMP_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	Division = GetInt(MusHeader + HMP_DIVISION_OFFSET);
	InitialTempo = 1000000;

	Tracks = new TrackInfo[NumTracks + 1];

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = track_data;
		int tracklen;

		if (start > len - HMPTRACK_MIDI_DATA_OFFSET)
		{ // Track is incomplete.
			break;
		}

		tracklen = GetInt(MusHeader + start + HMPTRACK_LEN_OFFSET);
		track_data += tracklen;

		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Subtract track header size.
		tracklen -= HMPTRACK_MIDI_DATA_OFFSET;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + HMPTRACK_MIDI_DATA_OFFSET;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
#if 0
		// This is completely a guess based on knowledge of how designations work with
		// HMI files. Some songs contain nothing but zeroes for this data, so I'd rather
		// not go around using it without confirmation.

		Printf("Track %d: %d %08x %d:  \034I", i, GetInt(MusHeader + start),
			GetInt(MusHeader + start + 4), GetInt(MusHeader + start + 8));

		int designations = HMP_DESIGNATIONS_OFFSET +
			GetInt(MusHeader + start + HMPTRACK_DESIGNATION_OFFSET) * 4 * NUM_HMP_DESIGNATIONS;
		for (int ii = 0; ii < NUM_HMP_DESIGNATIONS; ++ii)
		{
			Printf(" %04x", GetInt(MusHeader + designations + ii*4));
		}
		Printf("\n");
#endif
		Tracks[p].Designation[0] = HMI_DEV_GM;
		Tracks[p].Designation[1] = HMI_DEV_GUS;
		Tracks[p].Designation[2] = HMI_DEV_OPL2;
		Tracks[p].Designation[3] = 0;

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}